

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O3

string * pybind11::type_id<std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>>(void)

{
  string *extraout_RAX;
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,"St10shared_ptrIN6anurbs18NurbsCurveGeometryILl2EEEE","");
  detail::clean_type_id(in_RDI);
  return extraout_RAX;
}

Assistant:

static std::string type_id() {
    std::string name(typeid(T).name());
    detail::clean_type_id(name);
    return name;
}